

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O1

void __thiscall
Lib::Set<const_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash>::Set
          (Set<const_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash> *this)

{
  undefined4 *in_RDI;
  Set<const_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash> *in_stack_00000028;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  expand(in_stack_00000028);
  return;
}

Assistant:

Set()
    : _capacity(0),
      _nonemptyCells(0),
      _size(0),
      _entries(0)
  {
    expand();
  }